

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool despot::option::Parser::streqabbr(char *st1,char *st2,longlong min)

{
  char cVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    cVar1 = st2[lVar2];
    if (st1[lVar2] == '\0') {
LAB_0016d9f7:
      return cVar1 == '=' || cVar1 == '\0';
    }
    if (st1[lVar2] != cVar1) {
      if (lVar2 < min || min < 1) {
        return false;
      }
      goto LAB_0016d9f7;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static bool streqabbr(const char* st1, const char* st2, long long min) {
		const char* st1start = st1;
		while (*st1 != 0 && (*st1 == *st2)) {
			++st1;
			++st2;
		}

		return (*st1 == 0 || (min > 0 && (st1 - st1start) >= min))
			&& (*st2 == 0 || *st2 == '=');
	}